

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minimize_constraint.cpp
# Opt level: O2

bool __thiscall
Clasp::UncoreMinimize::Todo::shrinkNext(Todo *this,UncoreMinimize *self,ValueRep result)

{
  uint uVar1;
  bool bVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  
  if (((uint)self->options_ & 0xe0) == 0xc0) {
    bVar2 = subsetNext(this,self,result);
    return bVar2;
  }
  if (result == '\x02') {
    uVar3 = this->last_;
    this->next_ = uVar3;
    this->step_ = 0;
    uVar6 = 0;
  }
  else {
    uVar3 = this->next_;
    uVar6 = this->step_;
    this->last_ = uVar3;
  }
  uVar5 = (uint)self->options_ >> 5 & 7;
  uVar1 = (this->lits_).ebo_.size;
  uVar4 = 1;
  if (uVar5 - 4 < 2) {
    if (uVar6 == 0) {
      uVar4 = (uint)(uVar3 == 0);
      goto LAB_0014ed7b;
    }
    if (uVar3 + uVar6 < uVar1) {
      uVar7 = uVar6 * 2;
      uVar4 = uVar6;
LAB_0014ed8e:
      this->step_ = uVar7;
      goto LAB_0014ed92;
    }
    if (uVar5 == 4) {
      uVar7 = 2;
      goto LAB_0014ed8e;
    }
    uVar4 = uVar1 - uVar3 >> 1;
  }
  else {
    if (uVar5 == 3) {
      uVar4 = uVar1 - uVar3 >> 1;
    }
    else {
      uVar7 = uVar4;
      if (uVar5 != 2) goto LAB_0014ed8e;
      uVar4 = ~uVar3 + uVar1;
    }
LAB_0014ed7b:
    this->step_ = uVar4;
  }
  if (uVar4 == 0) {
    return false;
  }
LAB_0014ed92:
  this->next_ = uVar3 + uVar4;
  return uVar3 + uVar4 < uVar1;
}

Assistant:

bool UncoreMinimize::Todo::shrinkNext(UncoreMinimize& self, ValueRep result) {
	if (self.options_.trim == OptParams::usc_trim_min) {
		return subsetNext(self, result);
	}
	if (result == value_false) {
		next_ = last_;
		step_ = 0u;
	}
	else {
		last_ = next_;
	}
	const uint32 t  = self.options_.trim;
	const uint32 mx = size();
	uint32 s = step_;
	switch (t) {
		default:
		case OptParams::usc_trim_lin: step_ = s = 1;                break;
		case OptParams::usc_trim_inv: step_ = s = (mx - next_) - 1; break;
		case OptParams::usc_trim_bin: step_ = s = (mx - next_) / 2; break;
		case OptParams::usc_trim_rgs: // fallthrough
		case OptParams::usc_trim_exp:
			if      (s == 0u)                      { step_ = s = uint32(last_ == 0u); }
			else if ((next_ + s) < mx)             { step_ = s * 2; }
			else if (t == OptParams::usc_trim_rgs) { step_ = 2; s = 1; }
			else                                   { s = (mx - next_) / 2; }
			break;
	}
	return s && (next_ += s) < mx;
}